

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O3

void observer(uint w)

{
  U *pUVar1;
  int *piVar2;
  vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_> *this;
  code *pcVar3;
  double dVar4;
  undefined8 uVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  uint uVar7;
  long *plVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int i;
  ulong uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar16;
  vector<tf::Task,_std::allocator<tf::Task>_> tasks;
  ResultBuilder DOCTEST_RB;
  shared_ptr<tf::ChromeObserver> observer;
  Taskflow taskflowA;
  Executor executor;
  Result local_328;
  vector<tf::Task,_std::allocator<tf::Task>_> local_308;
  int local_2e4;
  ResultBuilder local_2e0;
  undefined1 local_268 [40];
  pointer local_240;
  undefined4 local_238;
  undefined1 local_230 [88];
  undefined1 auStack_1d8 [40];
  _Elt_pointer local_1b0;
  _List_node_base *p_Stack_1a8;
  _List_node_base *local_1a0;
  _Elt_pointer psStack_198;
  pointer local_190;
  pointer pBStack_188;
  pointer local_180;
  bool local_170;
  Executor local_168;
  
  local_268._16_8_ = 0;
  local_268._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)w,(shared_ptr<tf::WorkerInterface> *)(local_268 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._24_8_);
  }
  tf::Executor::make_observer<tf::ChromeObserver>((Executor *)local_268);
  local_230._0_8_ = local_230 + 0x50;
  local_230._8_8_ = 0;
  local_230._16_8_ = (pointer)0x0;
  local_230._24_8_ = (pointer)0x0;
  local_230._32_8_ = (pointer)0x0;
  local_230._40_8_ = (__pthread_internal_list *)0x0;
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_230._80_8_ = (pointer)0x0;
  auStack_1d8._0_8_ = 0;
  auStack_1d8._8_8_ = 0;
  auStack_1d8._16_8_ = 0;
  auStack_1d8._24_8_ = (__pthread_internal_list *)0x0;
  auStack_1d8._32_8_ = (__pthread_internal_list *)0x0;
  local_1b0 = (_Elt_pointer)0x0;
  p_Stack_1a8 = (_List_node_base *)0x0;
  local_1a0 = (_List_node_base *)0x0;
  psStack_198 = (_Elt_pointer)0x0;
  local_190 = (pointer)0x0;
  pBStack_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)(auStack_1d8 + 0x10),0);
  local_170 = false;
  local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_start = (Task *)0x0;
  local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Task *)0x0;
  local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Task *)0x0;
  iVar10 = 0x40;
  do {
    uVar5 = local_230._0_8_;
    local_2e0.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((Node *)local_2e0.super_AssertData.m_test_case)->_nstate = 0;
    ((Node *)local_2e0.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_2e0.super_AssertData.m_test_case)->_name).field_2;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_name)._M_string_length = 0;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_2e0.super_AssertData.m_test_case)->_edges).
              super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_2e0.super_AssertData.m_test_case)->_data = (void *)0x0;
    ((Node *)local_2e0.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
    ((Node *)local_2e0.super_AssertData.m_test_case)->_parent = (Node *)0x0;
    ((Node *)local_2e0.super_AssertData.m_test_case)->_num_successors = 0;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_2e0.super_AssertData.m_test_case)->_join_counter;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_join_counter).
    super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     &(((Node *)local_2e0.super_AssertData.m_test_case)->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_2e0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(code **)((long)&(((Node *)local_2e0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp:999:42)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_2e0.super_AssertData.m_test_case)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp:999:42)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_2e0.super_AssertData.m_test_case)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    (((Node *)local_2e0.super_AssertData.m_test_case)->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (((Node *)local_2e0.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
         (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar5,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2e0);
    if ((Node *)local_2e0.super_AssertData.m_test_case != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_2e0,
                 (Node *)local_2e0.super_AssertData.m_test_case);
    }
    local_328._0_8_ =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar5)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    if (local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<tf::Task,_std::allocator<tf::Task>_>::_M_realloc_insert<tf::Task>
                (&local_308,
                 (iterator)
                 local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Task *)&local_328);
    }
    else {
      (local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
       super__Vector_impl_data._M_finish)->_node = (Node *)local_328._0_8_;
      local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  lVar9 = 8;
  lVar13 = 0x3f;
  uVar14 = 0;
  do {
    lVar11 = lVar13;
    lVar12 = lVar9;
    if (uVar14 < 0x3f) {
      do {
        uVar7 = rand();
        if ((uVar7 & 1) == 0) {
          tf::Task::precede<tf::Task&>
                    (local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar14,
                     (Task *)((long)&(local_308.
                                      super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->_node + lVar12));
        }
        lVar11 = lVar11 + -1;
        lVar12 = lVar12 + 8;
      } while (lVar11 != 0);
    }
    uVar14 = uVar14 + 1;
    lVar9 = lVar9 + 8;
    lVar13 = lVar13 + -1;
  } while (uVar14 != 0x40);
  local_328._0_8_ = (Node *)0x10;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>
            ((Future<void> *)&local_2e0,&local_168,(Taskflow *)local_230,
             (anon_class_8_1_69701ed9 *)&local_328,(anon_class_1_0_00000001 *)&local_240);
  std::future<void>::get((future<void> *)&local_2e0);
  plVar8 = (long *)CONCAT44(local_2e0.super_AssertData._28_4_,local_2e0.super_AssertData.m_line);
  if (plVar8 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = (int *)((long)plVar8 + 0xc);
      iVar10 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    else {
      iVar10 = *(int *)((long)plVar8 + 0xc);
      *(int *)((long)plVar8 + 0xc) = iVar10 + -1;
    }
    if (iVar10 == 1) {
      (**(code **)(*plVar8 + 0x18))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_2e0.super_AssertData._12_4_,local_2e0.super_AssertData.m_at) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_2e0.super_AssertData._12_4_,local_2e0.super_AssertData.m_at));
  }
  local_240 = (pointer)0x0;
  local_2e0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_2e0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_2e0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_2e0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_2e0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_2e0.super_AssertData.m_at = DT_REQUIRE;
  local_2e0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
  ;
  local_2e0.super_AssertData.m_line = 0x3f5;
  local_2e0.super_AssertData.m_expr = "observer->num_tasks() == 64*16";
  local_2e0.super_AssertData.m_failed = true;
  local_2e0.super_AssertData.m_threw = false;
  local_2e0.super_AssertData.m_threw_as = false;
  local_2e0.super_AssertData.m_exception_type = "";
  local_2e0.super_AssertData.m_exception_string = "";
  plVar8 = *(long **)(local_268._0_8_ + 0x10);
  if (plVar8 != *(long **)(local_268._0_8_ + 0x18)) {
    local_240 = (pointer)0x0;
    do {
      local_240 = (pointer)((long)local_240 + (plVar8[1] - *plVar8 >> 4) * -0x5555555555555555);
      plVar8 = plVar8 + 3;
    } while (plVar8 != *(long **)(local_268._0_8_ + 0x18));
  }
  local_238 = 0xc;
  local_2e4 = 0x400;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const> *)&local_240,&local_2e4);
  doctest::String::operator=
            (&local_2e0.super_AssertData.m_decomp,(String *)&local_328.m_decomp.field_0.data);
  local_2e0.super_AssertData._40_2_ =
       CONCAT11(local_2e0.super_AssertData.m_threw,local_328.m_passed) ^ 1;
  uVar15 = extraout_XMM0_Da;
  uVar16 = extraout_XMM0_Db;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_328.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar15 = extraout_XMM0_Da_00;
    uVar16 = extraout_XMM0_Db_00;
  }
  dVar4 = doctest::detail::ResultBuilder::log(&local_2e0,(double)CONCAT44(uVar16,uVar15));
  if (extraout_AL != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar4,0));
    return;
  }
  if ((local_2e0.super_AssertData.m_failed == true) &&
     (bVar6 = doctest::detail::checkIfShouldThrow(local_2e0.super_AssertData.m_at), bVar6)) {
    doctest::detail::throwException();
  }
  if ((local_2e0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2e0.super_AssertData.m_decomp.field_0._1_7_,
                       local_2e0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2e0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_2e0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_2e0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2e0.super_AssertData.m_exception.field_0._1_7_,
                       local_2e0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2e0.super_AssertData.m_exception.field_0._1_7_,
                                       local_2e0.super_AssertData.m_exception.field_0.buf[0]));
  }
  uVar5 = local_268._0_8_;
  lVar9 = *(long *)(local_268._0_8_ + 0x10);
  if (*(long *)(local_268._0_8_ + 0x18) != lVar9) {
    uVar14 = 0;
    do {
      this = (vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_> *)
             (lVar9 + uVar14 * 0x18);
      std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>::
      _M_erase_at_end(this,(this->
                           super__Vector_base<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>
                           )._M_impl.super__Vector_impl_data._M_start);
      lVar9 = *(long *)(uVar5 + 0x28);
      lVar13 = uVar14 * 0x50;
      if (*(long *)(lVar9 + 0x30 + lVar13) != *(long *)(lVar9 + 0x10 + lVar13)) {
        do {
          std::
          deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
          ::pop_back((deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                      *)(lVar9 + lVar13));
          lVar9 = *(long *)(uVar5 + 0x28);
        } while (*(long *)(lVar9 + 0x30 + lVar13) != *(long *)(lVar9 + 0x10 + lVar13));
      }
      uVar14 = uVar14 + 1;
      lVar9 = *(long *)(uVar5 + 0x10);
    } while (uVar14 < (ulong)((*(long *)(uVar5 + 0x18) - lVar9 >> 3) * -0x5555555555555555));
  }
  local_240 = (pointer)0x0;
  local_2e0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_2e0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_2e0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_2e0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_2e0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_2e0.super_AssertData.m_at = DT_REQUIRE;
  local_2e0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
  ;
  local_2e0.super_AssertData.m_line = 0x3f8;
  local_2e0.super_AssertData.m_expr = "observer->num_tasks() == 0";
  local_2e0.super_AssertData.m_failed = true;
  local_2e0.super_AssertData.m_threw = false;
  local_2e0.super_AssertData.m_threw_as = false;
  local_2e0.super_AssertData.m_exception_type = "";
  local_2e0.super_AssertData.m_exception_string = "";
  plVar8 = *(long **)(local_268._0_8_ + 0x10);
  if (plVar8 != *(long **)(local_268._0_8_ + 0x18)) {
    local_240 = (pointer)0x0;
    do {
      local_240 = (pointer)((long)local_240 + (plVar8[1] - *plVar8 >> 4) * -0x5555555555555555);
      plVar8 = plVar8 + 3;
    } while (plVar8 != *(long **)(local_268._0_8_ + 0x18));
  }
  local_238 = 0xc;
  local_2e4 = 0;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const> *)&local_240,&local_2e4);
  doctest::String::operator=
            (&local_2e0.super_AssertData.m_decomp,(String *)&local_328.m_decomp.field_0.data);
  local_2e0.super_AssertData._40_2_ =
       CONCAT11(local_2e0.super_AssertData.m_threw,local_328.m_passed) ^ 1;
  uVar15 = extraout_XMM0_Da_01;
  uVar16 = extraout_XMM0_Db_01;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_328.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar15 = extraout_XMM0_Da_02;
    uVar16 = extraout_XMM0_Db_02;
  }
  dVar4 = doctest::detail::ResultBuilder::log(&local_2e0,(double)CONCAT44(uVar16,uVar15));
  if (extraout_AL_00 == '\0') {
    if ((local_2e0.super_AssertData.m_failed == true) &&
       (bVar6 = doctest::detail::checkIfShouldThrow(local_2e0.super_AssertData.m_at), bVar6)) {
      doctest::detail::throwException();
    }
    if ((local_2e0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2e0.super_AssertData.m_decomp.field_0._1_7_,
                         local_2e0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2e0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_2e0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_2e0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2e0.super_AssertData.m_exception.field_0._1_7_,
                         local_2e0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2e0.super_AssertData.m_exception.field_0._1_7_,
                                         local_2e0.super_AssertData.m_exception.field_0.buf[0]));
    }
    if (local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    tf::Taskflow::~Taskflow((Taskflow *)local_230);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
    }
    tf::Executor::~Executor(&local_168);
    return;
  }
  pcVar3 = (code *)swi(3);
  (*pcVar3)(SUB84(dVar4,0));
  return;
}

Assistant:

void observer(unsigned w) {

  tf::Executor executor(w);

  auto observer = executor.make_observer<tf::ChromeObserver>();

  tf::Taskflow taskflowA;
  std::vector<tf::Task> tasks;
  // Static tasking
  for(auto i=0; i < 64; i ++) {
    tasks.emplace_back(taskflowA.emplace([](){}));
  }

  // Randomly specify dependency
  for(auto i=0; i < 64; i ++) {
    for(auto j=i+1; j < 64; j++) {
      if(rand()%2 == 0) {
        tasks[i].precede(tasks[j]);
      }
    }
  }

  executor.run_n(taskflowA, 16).get();

  REQUIRE(observer->num_tasks() == 64*16);

  observer->clear();
  REQUIRE(observer->num_tasks() == 0);
  tasks.clear();

}